

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ReduceMaxLayerParams::Clear(ReduceMaxLayerParams *this)

{
  ReduceMaxLayerParams *this_local;
  
  google::protobuf::RepeatedField<long>::Clear(&this->axes_);
  memset(&this->keepdims_,0,2);
  return;
}

Assistant:

void ReduceMaxLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ReduceMaxLayerParams)
  axes_.Clear();
  ::memset(&keepdims_, 0, reinterpret_cast<char*>(&reduceall_) -
    reinterpret_cast<char*>(&keepdims_) + sizeof(reduceall_));
}